

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyPixels.cpp
# Opt level: O2

void testCopyPixels(string *tempDir)

{
  ostream *poVar1;
  half *phVar2;
  int in_R8D;
  int in_R9D;
  int y;
  long lVar3;
  int x;
  long lVar4;
  half *this;
  double dVar5;
  double dVar6;
  Array2D<Imath_3_2::half> ph;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing fast pixel copying");
  std::endl<char,std::char_traits<char>>(poVar1);
  ph._sizeX = 0x22f;
  ph._sizeY = 0x173;
  phVar2 = (half *)operator_new__(0x6543a);
  ph._data = phVar2;
  for (lVar3 = 0; lVar3 != 0x22f; lVar3 = lVar3 + 1) {
    this = phVar2;
    for (lVar4 = 0; lVar4 != 0x173; lVar4 = lVar4 + 1) {
      dVar5 = sin((double)(int)lVar4);
      dVar6 = sin((double)(int)lVar3 * 0.5);
      Imath_3_2::half::operator=(this,(float)(dVar6 + dVar5));
      this = this + 1;
    }
    phVar2 = phVar2 + 0x173;
  }
  anon_unknown.dwarf_d5617::writeCopyRead(tempDir,&ph,0,0,in_R8D,in_R9D);
  anon_unknown.dwarf_d5617::writeCopyRead(tempDir,&ph,0,0x1d,in_R8D,in_R9D);
  anon_unknown.dwarf_d5617::writeCopyRead(tempDir,&ph,0x11,0,in_R8D,in_R9D);
  anon_unknown.dwarf_d5617::writeCopyRead(tempDir,&ph,0x11,0x1d,in_R8D,in_R9D);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&ph);
  return;
}

Assistant:

void
testCopyPixels (const std::string& tempDir)
{
    try
    {
        cout << "Testing fast pixel copying" << endl;

        const int W  = 371;
        const int H  = 559;
        const int DX = 17;
        const int DY = 29;

        Array2D<half> ph (H, W);

        fillPixels (ph, W, H);
        writeCopyRead (tempDir, ph, W, H, 0, 0);
        writeCopyRead (tempDir, ph, W, H, 0, DY);
        writeCopyRead (tempDir, ph, W, H, DX, 0);
        writeCopyRead (tempDir, ph, W, H, DX, DY);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}